

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schemeobject.cpp
# Opt level: O2

string * __thiscall
SchemeBool::external_repr_abi_cxx11_(string *__return_storage_ptr__,SchemeBool *this)

{
  char *pcVar1;
  allocator local_9;
  
  pcVar1 = "#f";
  if (this->value != false) {
    pcVar1 = "#t";
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar1,&local_9);
  return __return_storage_ptr__;
}

Assistant:

std::string SchemeBool::external_repr() const
{
    return value ? "#t" : "#f";
}